

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O1

bool testing::internal::ShouldShard
               (char *total_shards_env,char *shard_index_env,bool in_subprocess_for_death_test)

{
  uint uVar1;
  uint uVar2;
  undefined7 in_register_00000011;
  Message msg;
  string local_40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  if ((int)CONCAT71(in_register_00000011,in_subprocess_for_death_test) == 0) {
    uVar1 = Int32FromEnvOrDie(total_shards_env,-1);
    uVar2 = Int32FromEnvOrDie(shard_index_env,-1);
    if ((uVar2 & uVar1) != 0xffffffff) {
      if (uVar2 == 0xffffffff || uVar1 != 0xffffffff) {
        if (uVar1 == 0xffffffff || uVar2 != 0xffffffff) {
          if ((-1 < (int)uVar2) && ((int)uVar2 < (int)uVar1)) {
            return 1 < (int)uVar1;
          }
          Message::Message((Message *)&local_40);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_40._M_dataplus._M_p + 0x10),
                     "Invalid environment variables: we require 0 <= ",0x2f);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_40._M_dataplus._M_p + 0x10),"GTEST_SHARD_INDEX",0x11);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_40._M_dataplus._M_p + 0x10)," < ",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_40._M_dataplus._M_p + 0x10),"GTEST_TOTAL_SHARDS",0x12);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_40._M_dataplus._M_p + 0x10),", but you have ",0xf);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_40._M_dataplus._M_p + 0x10),"GTEST_SHARD_INDEX",0x11);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_40._M_dataplus._M_p + 0x10),"=",1);
          std::ostream::operator<<(local_40._M_dataplus._M_p + 0x10,uVar2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_40._M_dataplus._M_p + 0x10),", ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_40._M_dataplus._M_p + 0x10),"GTEST_TOTAL_SHARDS",0x12);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_40._M_dataplus._M_p + 0x10),"=",1);
          std::ostream::operator<<(local_40._M_dataplus._M_p + 0x10,uVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_40._M_dataplus._M_p + 0x10),".\n",2);
          Message::Message((Message *)&local_20,(Message *)&local_40);
          if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
            local_40._M_dataplus._M_p = (pointer)0x0;
          }
          StringStreamToString(&local_40,local_20.ptr_);
        }
        else {
          Message::Message((Message *)&local_40);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_40._M_dataplus._M_p + 0x10),
                     "Invalid environment variables: you have ",0x28);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_40._M_dataplus._M_p + 0x10),"GTEST_TOTAL_SHARDS",0x12);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_40._M_dataplus._M_p + 0x10)," = ",3);
          std::ostream::operator<<(local_40._M_dataplus._M_p + 0x10,uVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_40._M_dataplus._M_p + 0x10),", but have left ",0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_40._M_dataplus._M_p + 0x10),"GTEST_SHARD_INDEX",0x11);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_40._M_dataplus._M_p + 0x10)," unset.\n",8);
          Message::Message((Message *)&local_20,(Message *)&local_40);
          if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
            local_40._M_dataplus._M_p = (pointer)0x0;
          }
          StringStreamToString(&local_40,local_20.ptr_);
        }
      }
      else {
        Message::Message((Message *)&local_40);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_40._M_dataplus._M_p + 0x10),
                   "Invalid environment variables: you have ",0x28);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_40._M_dataplus._M_p + 0x10),"GTEST_SHARD_INDEX",0x11);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_40._M_dataplus._M_p + 0x10)," = ",3);
        std::ostream::operator<<(local_40._M_dataplus._M_p + 0x10,uVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_40._M_dataplus._M_p + 0x10),", but have left ",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_40._M_dataplus._M_p + 0x10),"GTEST_TOTAL_SHARDS",0x12);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_40._M_dataplus._M_p + 0x10)," unset.\n",8);
        Message::Message((Message *)&local_20,(Message *)&local_40);
        if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
          local_40._M_dataplus._M_p = (pointer)0x0;
        }
        StringStreamToString(&local_40,local_20.ptr_);
      }
      ColoredPrintf(COLOR_RED,local_40._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_40);
      fflush(_stdout);
      exit(1);
    }
  }
  return false;
}

Assistant:

bool ShouldShard(const char* total_shards_env,
                 const char* shard_index_env,
                 bool in_subprocess_for_death_test) {
  if (in_subprocess_for_death_test) {
    return false;
  }

  const Int32 total_shards = Int32FromEnvOrDie(total_shards_env, -1);
  const Int32 shard_index = Int32FromEnvOrDie(shard_index_env, -1);

  if (total_shards == -1 && shard_index == -1) {
    return false;
  } else if (total_shards == -1 && shard_index != -1) {
    const Message msg = Message()
      << "Invalid environment variables: you have "
      << kTestShardIndex << " = " << shard_index
      << ", but have left " << kTestTotalShards << " unset.\n";
    ColoredPrintf(COLOR_RED, msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  } else if (total_shards != -1 && shard_index == -1) {
    const Message msg = Message()
      << "Invalid environment variables: you have "
      << kTestTotalShards << " = " << total_shards
      << ", but have left " << kTestShardIndex << " unset.\n";
    ColoredPrintf(COLOR_RED, msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  } else if (shard_index < 0 || shard_index >= total_shards) {
    const Message msg = Message()
      << "Invalid environment variables: we require 0 <= "
      << kTestShardIndex << " < " << kTestTotalShards
      << ", but you have " << kTestShardIndex << "=" << shard_index
      << ", " << kTestTotalShards << "=" << total_shards << ".\n";
    ColoredPrintf(COLOR_RED, msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  }

  return total_shards > 1;
}